

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::translateInternal
          (StructTranslator *this,MemberInfo *root,Builder builder)

{
  Which WVar1;
  short sVar2;
  MemberInfo *this_00;
  NodeTranslator *pNVar3;
  ErrorReporter *pEVar4;
  Reader ordinal;
  Reader type;
  Reader source;
  Reader type_00;
  Reader type_01;
  Builder target;
  Builder target_00;
  Builder target_01;
  Builder target_02;
  Reader type_02;
  Builder target_03;
  StringPtr targetsFlagName_00;
  bool bVar5;
  Which WVar6;
  uint16_t uVar7;
  ElementSize value;
  uint32_t uVar8;
  reference ppVar9;
  MemberInfo **ppMVar10;
  Top *pTVar11;
  Vector<capnp::compiler::NodeTranslator::AuxNode> *this_01;
  AuxNode *pAVar12;
  ArrayPtr<const_char> AVar13;
  bool local_6a9;
  BuilderFor<capnp::schema::Node> local_688;
  undefined1 local_660 [8];
  Builder groupBuilder;
  AuxNode *group;
  AuxNode *__end2_2;
  AuxNode *__begin2_2;
  Vector<capnp::compiler::NodeTranslator::AuxNode> *__range2_2;
  Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> local_5d0;
  Builder local_5b0;
  Fault local_588;
  Fault f_2;
  char *local_578;
  StringPtr local_570;
  StringPtr local_560;
  StringPtr local_550;
  undefined1 auStack_540 [8];
  StringPtr targetsFlagName;
  MemberInfo *member_1;
  MemberInfo **__end2_1;
  MemberInfo **__begin2_1;
  Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *__range2_1;
  Fault f_1;
  Fault f;
  Reader local_4f0;
  int local_4bc;
  undefined1 auStack_4b8 [4];
  int lgSize;
  CapTableBuilder *pCStack_4b0;
  void *local_4a8;
  WirePointer *pWStack_4a0;
  StructDataBitCount local_498;
  StructPointerCount SStack_494;
  undefined2 uStack_492;
  Reader local_490;
  Builder local_460;
  Reader local_438;
  Schema local_408;
  Builder local_400;
  Reader local_3d8;
  SegmentReader *local_3a8;
  CapTableReader *pCStack_3a0;
  void *local_398;
  WirePointer *pWStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  Builder local_370;
  Reader local_348;
  ArrayPtr<const_char> local_318;
  Reader local_308;
  StringPtr local_2d8;
  Reader local_2c8;
  ArrayPtr<const_char> local_298;
  uint64_t local_288;
  SegmentReader *pSStack_280;
  CapTableReader *local_278;
  byte *pbStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  SegmentBuilder *local_248;
  SegmentBuilder *pSStack_240;
  CapTableBuilder *local_238;
  void *pvStack_230;
  WirePointer *local_228;
  SegmentReader *local_218;
  CapTableReader *pCStack_210;
  void *local_208;
  WirePointer *pWStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 auStack_1e8 [8];
  Builder typeBuilder;
  Builder slot;
  undefined1 local_170 [8];
  Builder fieldBuilder;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_108 [8];
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_node_translator_c__:2163:7)>
  _kjContext2163;
  anon_class_8_1_60e67bd8 _kjContextFunc2163;
  MemberInfo *member;
  pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *entry;
  iterator __end2;
  iterator __begin2;
  multimap<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>_>
  *__range2;
  DuplicateOrdinalDetector dupDetector;
  Builder structBuilder;
  MemberInfo *root_local;
  StructTranslator *this_local;
  
  capnp::schema::Node::Builder::initStruct
            ((Builder *)&dupDetector.lastOrdinalLocation.ptr.field_1.value._reader.nestingLimit,
             &builder);
  DuplicateOrdinalDetector::DuplicateOrdinalDetector
            ((DuplicateOrdinalDetector *)&__range2,this->errorReporter);
  __end2 = std::
           multimap<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>_>
           ::begin(&this->membersByOrdinal);
  entry = (pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>
           *)std::
             multimap<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>_>
             ::end(&this->membersByOrdinal);
  do {
    bVar5 = std::operator!=(&__end2,(_Self *)&entry);
    if (!bVar5) {
      MemberInfo::finishGroup(root);
      __end2_1 = kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::begin
                           (&this->allMembers);
      ppMVar10 = kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::end
                           (&this->allMembers);
      do {
        if (__end2_1 == ppMVar10) {
          pTVar11 = StructLayout::getTop(&this->layout);
          capnp::schema::Node::Struct::Builder::setDataWordCount
                    ((Builder *)
                     &dupDetector.lastOrdinalLocation.ptr.field_1.value._reader.nestingLimit,
                     (uint16_t)pTVar11->dataWordCount);
          pTVar11 = StructLayout::getTop(&this->layout);
          capnp::schema::Node::Struct::Builder::setPointerCount
                    ((Builder *)
                     &dupDetector.lastOrdinalLocation.ptr.field_1.value._reader.nestingLimit,
                     (uint16_t)pTVar11->pointerCount);
          capnp::schema::Node::Struct::Builder::setPreferredListEncoding
                    ((Builder *)
                     &dupDetector.lastOrdinalLocation.ptr.field_1.value._reader.nestingLimit,
                     INLINE_COMPOSITE);
          this_01 = &this->translator->groups;
          __end2_2 = kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::begin(this_01);
          pAVar12 = kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::end(this_01);
          for (; __end2_2 != pAVar12; __end2_2 = __end2_2 + 1) {
            groupBuilder._builder._32_8_ = __end2_2;
            Orphan<capnp::schema::Node>::get(&local_688,&__end2_2->node);
            capnp::schema::Node::Builder::getStruct((Builder *)local_660,&local_688);
            uVar7 = capnp::schema::Node::Struct::Builder::getDataWordCount
                              ((Builder *)
                               &dupDetector.lastOrdinalLocation.ptr.field_1.value._reader.
                                nestingLimit);
            capnp::schema::Node::Struct::Builder::setDataWordCount((Builder *)local_660,uVar7);
            uVar7 = capnp::schema::Node::Struct::Builder::getPointerCount
                              ((Builder *)
                               &dupDetector.lastOrdinalLocation.ptr.field_1.value._reader.
                                nestingLimit);
            capnp::schema::Node::Struct::Builder::setPointerCount((Builder *)local_660,uVar7);
            value = capnp::schema::Node::Struct::Builder::getPreferredListEncoding
                              ((Builder *)
                               &dupDetector.lastOrdinalLocation.ptr.field_1.value._reader.
                                nestingLimit);
            capnp::schema::Node::Struct::Builder::setPreferredListEncoding
                      ((Builder *)local_660,value);
          }
          DuplicateOrdinalDetector::~DuplicateOrdinalDetector((DuplicateOrdinalDetector *)&__range2)
          ;
          return;
        }
        targetsFlagName.content.size_ = (size_t)*__end2_1;
        kj::StringPtr::StringPtr((StringPtr *)auStack_540);
        if ((*(byte *)(targetsFlagName.content.size_ + 0x62) & 1) == 0) {
          sVar2 = *(short *)(targetsFlagName.content.size_ + 0x60);
          if (sVar2 == 6) {
            kj::StringPtr::StringPtr(&local_560,"targetsField");
            auStack_540 = (undefined1  [8])local_560.content.ptr;
            targetsFlagName.content.ptr = (char *)local_560.content.size_;
          }
          else if (sVar2 == 7) {
            MemberInfo::finishGroup((MemberInfo *)targetsFlagName.content.size_);
            kj::StringPtr::StringPtr(&local_570,"targetsUnion");
            auStack_540 = (undefined1  [8])local_570.content.ptr;
            targetsFlagName.content.ptr = (char *)local_570.content.size_;
          }
          else {
            if (sVar2 != 8) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                        (&local_588,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                         ,0x8ef,FAILED,(char *)0x0,"\"Unexpected member type.\"",
                         (char (*) [24])"Unexpected member type.");
              kj::_::Debug::Fault::fatal(&local_588);
            }
            MemberInfo::finishGroup((MemberInfo *)targetsFlagName.content.size_);
            kj::StringPtr::StringPtr((StringPtr *)&f_2,"targetsGroup");
            auStack_540 = (undefined1  [8])f_2.exception;
            targetsFlagName.content.ptr = local_578;
          }
        }
        else {
          kj::StringPtr::StringPtr(&local_550,"targetsParam");
          auStack_540 = (undefined1  [8])local_550.content.ptr;
          targetsFlagName.content.ptr = (char *)local_550.content.size_;
        }
        MemberInfo::getSchema(&local_5b0,(MemberInfo *)targetsFlagName.content.size_);
        targetsFlagName_00.content.size_ = (size_t)targetsFlagName.content.ptr;
        targetsFlagName_00.content.ptr = (char *)auStack_540;
        compileAnnotationApplications
                  (&local_5d0,this->translator,
                   (Reader)*(ListReader *)(targetsFlagName.content.size_ + 200),targetsFlagName_00);
        capnp::schema::Field::Builder::adoptAnnotations(&local_5b0,&local_5d0);
        Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_>::~Orphan(&local_5d0);
        __end2_1 = __end2_1 + 1;
      } while( true );
    }
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>
             ::operator*(&__end2);
    this_00 = ppVar9->second;
    _kjContext2163.func = (anon_class_8_1_60e67bd8 *)this_00;
    kj::_::Debug::
    ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++:2163:7)>
    ::ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_node_translator_c__:2163:7)>
                   *)local_108,(anon_class_8_1_60e67bd8 *)&_kjContext2163.func);
    bVar5 = Declaration::Id::Reader::isOrdinal(&this_00->declId);
    if (bVar5) {
      Declaration::Id::Reader::getOrdinal
                ((Reader *)&fieldBuilder._builder.dataSize,&this_00->declId);
      ordinal._reader.capTable = (CapTableReader *)uStack_140;
      ordinal._reader.segment = (SegmentReader *)fieldBuilder._builder._32_8_;
      ordinal._reader.data = (void *)local_138;
      ordinal._reader.pointers = (WirePointer *)uStack_130;
      ordinal._reader._32_8_ = local_128;
      ordinal._reader._40_8_ = uStack_120;
      DuplicateOrdinalDetector::check((DuplicateOrdinalDetector *)&__range2,ordinal);
    }
    MemberInfo::getSchema((Builder *)local_170,this_00);
    capnp::schema::Field::Builder::getOrdinal
              ((Builder *)&slot._builder.dataSize,(Builder *)local_170);
    capnp::schema::Field::Ordinal::Builder::setExplicit
              ((Builder *)&slot._builder.dataSize,(uint16_t)ppVar9->first);
    WVar1 = this_00->declKind;
    if (WVar1 == FIELD) {
      capnp::schema::Field::Builder::initSlot
                ((Builder *)&typeBuilder._builder.dataSize,(Builder *)local_170);
      capnp::schema::Field::Slot::Builder::initType
                ((Builder *)auStack_1e8,(Builder *)&typeBuilder._builder.dataSize);
      local_218 = (this_00->fieldType)._reader.segment;
      pCStack_210 = (this_00->fieldType)._reader.capTable;
      local_208 = (this_00->fieldType)._reader.data;
      pWStack_200 = (this_00->fieldType)._reader.pointers;
      local_1f8._0_4_ = (this_00->fieldType)._reader.dataSize;
      local_1f8._4_2_ = (this_00->fieldType)._reader.pointerCount;
      local_1f8._6_2_ = *(undefined2 *)&(this_00->fieldType)._reader.field_0x26;
      uStack_1f0 = *(undefined8 *)&(this_00->fieldType)._reader.nestingLimit;
      local_228 = typeBuilder._builder.pointers;
      local_238 = typeBuilder._builder.capTable;
      pvStack_230 = typeBuilder._builder.data;
      local_248 = (SegmentBuilder *)auStack_1e8;
      pSStack_240 = typeBuilder._builder.segment;
      local_258 = *(undefined8 *)&(this->implicitMethodParams).params.reader.nestingLimit;
      local_288 = (this->implicitMethodParams).scopeId;
      pSStack_280 = (this->implicitMethodParams).params.reader.segment;
      local_278 = (this->implicitMethodParams).params.reader.capTable;
      pbStack_270 = (this->implicitMethodParams).params.reader.ptr;
      local_268._0_4_ = (this->implicitMethodParams).params.reader.elementCount;
      local_268._4_4_ = (this->implicitMethodParams).params.reader.step;
      uStack_260._0_4_ = (this->implicitMethodParams).params.reader.structDataSize;
      uStack_260._4_2_ = (this->implicitMethodParams).params.reader.structPointerCount;
      uStack_260._6_1_ = (this->implicitMethodParams).params.reader.elementSize;
      uStack_260._7_1_ = (this->implicitMethodParams).params.reader.field_0x27;
      target._builder.capTable = (CapTableBuilder *)typeBuilder._builder.segment;
      target._builder.segment = (SegmentBuilder *)auStack_1e8;
      target._builder.data = typeBuilder._builder.capTable;
      target._builder.pointers = (WirePointer *)typeBuilder._builder.data;
      target._builder._32_8_ = typeBuilder._builder.pointers;
      bVar5 = compileType(this->translator,(Reader)(this_00->fieldType)._reader,target,
                          this->implicitMethodParams);
      if (bVar5) {
        if ((this_00->hasDefaultValue & 1U) == 0) {
          pNVar3 = this->translator;
          capnp::schema::Type::Builder::operator_cast_to_Reader(&local_438,(Builder *)auStack_1e8);
          capnp::schema::Field::Slot::Builder::initDefaultValue
                    (&local_460,(Builder *)&typeBuilder._builder.dataSize);
          type_00._reader.capTable = local_438._reader.capTable;
          type_00._reader.segment = local_438._reader.segment;
          type_00._reader.data = local_438._reader.data;
          type_00._reader.pointers = local_438._reader.pointers;
          type_00._reader.dataSize = local_438._reader.dataSize;
          type_00._reader.pointerCount = local_438._reader.pointerCount;
          type_00._reader._38_2_ = local_438._reader._38_2_;
          type_00._reader.nestingLimit = local_438._reader.nestingLimit;
          type_00._reader._44_4_ = local_438._reader._44_4_;
          target_01._builder.capTable = local_460._builder.capTable;
          target_01._builder.segment = local_460._builder.segment;
          target_01._builder.data = local_460._builder.data;
          target_01._builder.pointers = local_460._builder.pointers;
          target_01._builder.dataSize = local_460._builder.dataSize;
          target_01._builder.pointerCount = local_460._builder.pointerCount;
          target_01._builder._38_2_ = local_460._builder._38_2_;
          compileDefaultDefaultValue(pNVar3,type_00,target_01);
        }
        else {
          local_6a9 = false;
          if ((this_00->isParam & 1U) != 0) {
            bVar5 = Expression::Reader::isRelativeName(&this_00->fieldDefaultValue);
            local_6a9 = false;
            if (bVar5) {
              Expression::Reader::getRelativeName(&local_2c8,&this_00->fieldDefaultValue);
              AVar13 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_2c8);
              local_298 = AVar13;
              kj::StringPtr::StringPtr(&local_2d8,"null");
              local_6a9 = kj::StringPtr::operator==((StringPtr *)&local_298,&local_2d8);
            }
          }
          if (local_6a9 == false) {
            pNVar3 = this->translator;
            local_3a8 = (this_00->fieldDefaultValue)._reader.segment;
            pCStack_3a0 = (this_00->fieldDefaultValue)._reader.capTable;
            local_398 = (this_00->fieldDefaultValue)._reader.data;
            pWStack_390 = (this_00->fieldDefaultValue)._reader.pointers;
            local_388._0_4_ = (this_00->fieldDefaultValue)._reader.dataSize;
            local_388._4_2_ = (this_00->fieldDefaultValue)._reader.pointerCount;
            local_388._6_2_ = *(undefined2 *)&(this_00->fieldDefaultValue)._reader.field_0x26;
            uStack_380 = *(undefined8 *)&(this_00->fieldDefaultValue)._reader.nestingLimit;
            capnp::schema::Type::Builder::operator_cast_to_Reader(&local_3d8,(Builder *)auStack_1e8)
            ;
            capnp::schema::Field::Slot::Builder::initDefaultValue
                      (&local_400,(Builder *)&typeBuilder._builder.dataSize);
            Schema::Schema(&local_408);
            source._reader.capTable = pCStack_3a0;
            source._reader.segment = local_3a8;
            source._reader.data = local_398;
            source._reader.pointers = pWStack_390;
            source._reader.dataSize = (undefined4)local_388;
            source._reader.pointerCount = local_388._4_2_;
            source._reader._38_2_ = local_388._6_2_;
            source._reader._40_8_ = uStack_380;
            type_02._reader.capTable = local_3d8._reader.capTable;
            type_02._reader.segment = local_3d8._reader.segment;
            type_02._reader.data = local_3d8._reader.data;
            type_02._reader.pointers = local_3d8._reader.pointers;
            type_02._reader.dataSize = local_3d8._reader.dataSize;
            type_02._reader.pointerCount = local_3d8._reader.pointerCount;
            type_02._reader._38_2_ = local_3d8._reader._38_2_;
            type_02._reader.nestingLimit = local_3d8._reader.nestingLimit;
            type_02._reader._44_4_ = local_3d8._reader._44_4_;
            target_03._builder.capTable = local_400._builder.capTable;
            target_03._builder.segment = local_400._builder.segment;
            target_03._builder.data = local_400._builder.data;
            target_03._builder.pointers = local_400._builder.pointers;
            target_03._builder.dataSize = local_400._builder.dataSize;
            target_03._builder.pointerCount = local_400._builder.pointerCount;
            target_03._builder._38_2_ = local_400._builder._38_2_;
            compileBootstrapValue(pNVar3,source,type_02,target_03,local_408);
          }
          else {
            WVar6 = capnp::schema::Type::Builder::which((Builder *)auStack_1e8);
            if ((2 < WVar6 - 0xc) && (2 < WVar6 - 0x10)) {
              pEVar4 = this->errorReporter;
              Expression::Reader::getRelativeName(&local_308,&this_00->fieldDefaultValue);
              kj::StringPtr::StringPtr
                        ((StringPtr *)&local_318,
                         "Only pointer parameters can declare their default as \'null\'.");
              ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader>
                        (pEVar4,&local_308,(StringPtr)local_318);
            }
            pNVar3 = this->translator;
            capnp::schema::Type::Builder::operator_cast_to_Reader(&local_348,(Builder *)auStack_1e8)
            ;
            capnp::schema::Field::Slot::Builder::initDefaultValue
                      (&local_370,(Builder *)&typeBuilder._builder.dataSize);
            type._reader.capTable = local_348._reader.capTable;
            type._reader.segment = local_348._reader.segment;
            type._reader.data = local_348._reader.data;
            type._reader.pointers = local_348._reader.pointers;
            type._reader.dataSize = local_348._reader.dataSize;
            type._reader.pointerCount = local_348._reader.pointerCount;
            type._reader._38_2_ = local_348._reader._38_2_;
            type._reader.nestingLimit = local_348._reader.nestingLimit;
            type._reader._44_4_ = local_348._reader._44_4_;
            target_00._builder.capTable = local_370._builder.capTable;
            target_00._builder.segment = local_370._builder.segment;
            target_00._builder.data = local_370._builder.data;
            target_00._builder.pointers = local_370._builder.pointers;
            target_00._builder.dataSize = local_370._builder.dataSize;
            target_00._builder.pointerCount = local_370._builder.pointerCount;
            target_00._builder._38_2_ = local_370._builder._38_2_;
            compileDefaultDefaultValue(pNVar3,type,target_00);
          }
          capnp::schema::Field::Slot::Builder::setHadExplicitDefault
                    ((Builder *)&typeBuilder._builder.dataSize,true);
        }
      }
      else {
        pNVar3 = this->translator;
        capnp::schema::Type::Builder::operator_cast_to_Reader(&local_490,(Builder *)auStack_1e8);
        capnp::schema::Field::Slot::Builder::initDefaultValue
                  ((Builder *)auStack_4b8,(Builder *)&typeBuilder._builder.dataSize);
        type_01._reader.capTable = local_490._reader.capTable;
        type_01._reader.segment = local_490._reader.segment;
        type_01._reader.data = local_490._reader.data;
        type_01._reader.pointers = local_490._reader.pointers;
        type_01._reader.dataSize = local_490._reader.dataSize;
        type_01._reader.pointerCount = local_490._reader.pointerCount;
        type_01._reader._38_2_ = local_490._reader._38_2_;
        type_01._reader.nestingLimit = local_490._reader.nestingLimit;
        type_01._reader._44_4_ = local_490._reader._44_4_;
        target_02._builder.capTable = pCStack_4b0;
        target_02._builder.segment = _auStack_4b8;
        target_02._builder.data = local_4a8;
        target_02._builder.pointers = pWStack_4a0;
        target_02._builder.dataSize = local_498;
        target_02._builder.pointerCount = SStack_494;
        target_02._builder._38_2_ = uStack_492;
        compileDefaultDefaultValue(pNVar3,type_01,target_02);
      }
      local_4bc = -1;
      WVar6 = capnp::schema::Type::Builder::which((Builder *)auStack_1e8);
      switch(WVar6) {
      case VOID:
        local_4bc = -1;
        break;
      case BOOL:
        local_4bc = 0;
        break;
      case INT8:
        local_4bc = 3;
        break;
      case INT16:
        local_4bc = 4;
        break;
      case INT32:
        local_4bc = 5;
        break;
      case INT64:
        local_4bc = 6;
        break;
      case UINT8:
        local_4bc = 3;
        break;
      case UINT16:
        local_4bc = 4;
        break;
      case UINT32:
        local_4bc = 5;
        break;
      case UINT64:
        local_4bc = 6;
        break;
      case FLOAT32:
        local_4bc = 5;
        break;
      case FLOAT64:
        local_4bc = 6;
        break;
      case TEXT:
        local_4bc = -2;
        break;
      case DATA:
        local_4bc = -2;
        break;
      case LIST:
        local_4bc = -2;
        break;
      case ENUM:
        local_4bc = 4;
        break;
      case STRUCT:
        local_4bc = -2;
        break;
      case INTERFACE:
        local_4bc = -2;
        break;
      case ANY_POINTER:
        local_4bc = -2;
      }
      if (local_4bc == -2) {
        uVar8 = (*(code *)((this_00->field_21).unionScope)->parent[2]._vptr_StructOrGroup)();
        capnp::schema::Field::Slot::Builder::setOffset
                  ((Builder *)&typeBuilder._builder.dataSize,uVar8);
      }
      else if (local_4bc == -1) {
        (*(code *)((this_00->field_21).unionScope)->parent->_vptr_StructOrGroup)();
        capnp::schema::Field::Slot::Builder::setOffset((Builder *)&typeBuilder._builder.dataSize,0);
      }
      else {
        uVar8 = (*(code *)((this_00->field_21).unionScope)->parent[1]._vptr_StructOrGroup)
                          ((this_00->field_21).unionScope,local_4bc);
        capnp::schema::Field::Slot::Builder::setOffset
                  ((Builder *)&typeBuilder._builder.dataSize,uVar8);
      }
    }
    else {
      if (WVar1 != UNION) {
        if (WVar1 == GROUP) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[28]>
                    (&f_1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                     ,0x8ce,FAILED,(char *)0x0,"\"Groups don\'t have ordinals.\"",
                     (char (*) [28])"Groups don\'t have ordinals.");
          kj::_::Debug::Fault::fatal(&f_1);
        }
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                  ((Fault *)&__range2_1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                   ,0x8d2,FAILED,(char *)0x0,"\"Unexpected member type.\"",
                   (char (*) [24])"Unexpected member type.");
        kj::_::Debug::Fault::fatal((Fault *)&__range2_1);
      }
      bVar5 = StructLayout::Union::addDiscriminant((this_00->field_21).unionScope);
      if (!bVar5) {
        pEVar4 = this->errorReporter;
        Declaration::Id::Reader::getOrdinal(&local_4f0,&this_00->declId);
        kj::StringPtr::StringPtr
                  ((StringPtr *)&f,
                   "Union ordinal, if specified, must be greater than no more than one of its member ordinals (i.e. there can only be one field retroactively unionized)."
                  );
        ErrorReporter::addErrorOn<capnp::compiler::LocatedInteger::Reader>
                  (pEVar4,&local_4f0,(StringPtr)_f);
      }
    }
    kj::_::Debug::
    ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++:2163:7)>
    ::~ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_node_translator_c__:2163:7)>
                    *)local_108);
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void translateInternal(MemberInfo& root, schema::Node::Builder builder) {
    auto structBuilder = builder.initStruct();

    // Go through each member in ordinal order, building each member schema.
    DuplicateOrdinalDetector dupDetector(errorReporter);
    for (auto& entry: membersByOrdinal) {
      MemberInfo& member = *entry.second;

      // Make sure the exceptions added relating to
      // https://github.com/sandstorm-io/capnproto/issues/344 identify the affected field.
      KJ_CONTEXT(member.name);

      if (member.declId.isOrdinal()) {
        dupDetector.check(member.declId.getOrdinal());
      }

      schema::Field::Builder fieldBuilder = member.getSchema();
      fieldBuilder.getOrdinal().setExplicit(entry.first);

      switch (member.declKind) {
        case Declaration::FIELD: {
          auto slot = fieldBuilder.initSlot();
          auto typeBuilder = slot.initType();
          if (translator.compileType(member.fieldType, typeBuilder, implicitMethodParams)) {
            if (member.hasDefaultValue) {
              if (member.isParam &&
                  member.fieldDefaultValue.isRelativeName() &&
                  member.fieldDefaultValue.getRelativeName().getValue() == "null") {
                // special case: parameter set null
                switch (typeBuilder.which()) {
                  case schema::Type::TEXT:
                  case schema::Type::DATA:
                  case schema::Type::LIST:
                  case schema::Type::STRUCT:
                  case schema::Type::INTERFACE:
                  case schema::Type::ANY_POINTER:
                    break;
                  default:
                    errorReporter.addErrorOn(member.fieldDefaultValue.getRelativeName(),
                        "Only pointer parameters can declare their default as 'null'.");
                    break;
                }
                translator.compileDefaultDefaultValue(typeBuilder, slot.initDefaultValue());
              } else {
                translator.compileBootstrapValue(member.fieldDefaultValue,
                                                 typeBuilder, slot.initDefaultValue());
              }
              slot.setHadExplicitDefault(true);
            } else {
              translator.compileDefaultDefaultValue(typeBuilder, slot.initDefaultValue());
            }
          } else {
            translator.compileDefaultDefaultValue(typeBuilder, slot.initDefaultValue());
          }

          int lgSize = -1;
          switch (typeBuilder.which()) {
            case schema::Type::VOID: lgSize = -1; break;
            case schema::Type::BOOL: lgSize = 0; break;
            case schema::Type::INT8: lgSize = 3; break;
            case schema::Type::INT16: lgSize = 4; break;
            case schema::Type::INT32: lgSize = 5; break;
            case schema::Type::INT64: lgSize = 6; break;
            case schema::Type::UINT8: lgSize = 3; break;
            case schema::Type::UINT16: lgSize = 4; break;
            case schema::Type::UINT32: lgSize = 5; break;
            case schema::Type::UINT64: lgSize = 6; break;
            case schema::Type::FLOAT32: lgSize = 5; break;
            case schema::Type::FLOAT64: lgSize = 6; break;

            case schema::Type::TEXT: lgSize = -2; break;
            case schema::Type::DATA: lgSize = -2; break;
            case schema::Type::LIST: lgSize = -2; break;
            case schema::Type::ENUM: lgSize = 4; break;
            case schema::Type::STRUCT: lgSize = -2; break;
            case schema::Type::INTERFACE: lgSize = -2; break;
            case schema::Type::ANY_POINTER: lgSize = -2; break;
          }

          if (lgSize == -2) {
            // pointer
            slot.setOffset(member.fieldScope->addPointer());
          } else if (lgSize == -1) {
            // void
            member.fieldScope->addVoid();
            slot.setOffset(0);
          } else {
            slot.setOffset(member.fieldScope->addData(lgSize));
          }
          break;
        }

        case Declaration::UNION:
          if (!member.unionScope->addDiscriminant()) {
            errorReporter.addErrorOn(member.declId.getOrdinal(),
                "Union ordinal, if specified, must be greater than no more than one of its "
                "member ordinals (i.e. there can only be one field retroactively unionized).");
          }
          break;

        case Declaration::GROUP:
          KJ_FAIL_ASSERT("Groups don't have ordinals.");
          break;

        default:
          KJ_FAIL_ASSERT("Unexpected member type.");
          break;
      }
    }

    // OK, we should have built all the members.  Now go through and make sure the discriminant
    // offsets have been copied over to the schemas and annotations have been applied.
    root.finishGroup();
    for (auto member: allMembers) {
      kj::StringPtr targetsFlagName;
      if (member->isParam) {
        targetsFlagName = "targetsParam";
      } else {
        switch (member->declKind) {
          case Declaration::FIELD:
            targetsFlagName = "targetsField";
            break;

          case Declaration::UNION:
            member->finishGroup();
            targetsFlagName = "targetsUnion";
            break;

          case Declaration::GROUP:
            member->finishGroup();
            targetsFlagName = "targetsGroup";
            break;

          default:
            KJ_FAIL_ASSERT("Unexpected member type.");
            break;
        }
      }

      member->getSchema().adoptAnnotations(translator.compileAnnotationApplications(
          member->declAnnotations, targetsFlagName));
    }

    // And fill in the sizes.
    structBuilder.setDataWordCount(layout.getTop().dataWordCount);
    structBuilder.setPointerCount(layout.getTop().pointerCount);
    structBuilder.setPreferredListEncoding(schema::ElementSize::INLINE_COMPOSITE);

    for (auto& group: translator.groups) {
      auto groupBuilder = group.node.get().getStruct();
      groupBuilder.setDataWordCount(structBuilder.getDataWordCount());
      groupBuilder.setPointerCount(structBuilder.getPointerCount());
      groupBuilder.setPreferredListEncoding(structBuilder.getPreferredListEncoding());
    }
  }